

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O3

uint8_t __thiscall m6502::AND(m6502 *this)

{
  byte bVar1;
  
  fetch(this);
  bVar1 = this->a & this->fetched;
  this->a = bVar1;
  this->status = bVar1 & 0x80 | (bVar1 == 0) * '\x02' | this->status & 0x7d;
  return '\x01';
}

Assistant:

uint8_t AND()
  {
    fetch();
    a &= fetched;
    SetFlag(Z, a == 0x00u);
    SetFlag(N, a & 0x80u);
    return 1;
  }